

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O0

int quicly_decode_reset_stream_frame(uint8_t **src,uint8_t *end,quicly_reset_stream_frame_t *frame)

{
  uint64_t uVar1;
  uint64_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t **in_RDI;
  uint64_t error_code;
  int local_4;
  
  uVar1 = ptls_decode_quicint(in_RDI,in_RSI);
  *in_RDX = uVar1;
  if ((uVar1 == 0xffffffffffffffff) ||
     (uVar1 = ptls_decode_quicint(in_RDI,in_RSI), uVar1 == 0xffffffffffffffff)) {
    local_4 = 0x20007;
  }
  else {
    *(short *)(in_RDX + 1) = (short)uVar1;
    uVar1 = ptls_decode_quicint(in_RDI,in_RSI);
    in_RDX[2] = uVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

inline int quicly_decode_reset_stream_frame(const uint8_t **src, const uint8_t *end, quicly_reset_stream_frame_t *frame)
{
    uint64_t error_code;

    if ((frame->stream_id = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((error_code = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    frame->app_error_code = (uint16_t)error_code;
    frame->final_size = quicly_decodev(src, end);
    return 0;
Error:
    return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;
}